

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugNames::NameIndex::dumpForeignTUs(NameIndex *this,ScopedPrinter *W)

{
  raw_ostream *this_00;
  uint32_t TU;
  StringRef N;
  format_object_base local_58;
  uint64_t local_48;
  uint32_t local_40;
  DelimitedScope<_[_,__]_> local_38;
  ListScope TUScope;
  
  if ((this->Hdr).super_HeaderPOD.ForeignTypeUnitCount != 0) {
    N.Length = 0x1c;
    N.Data = "Foreign Type Unit signatures";
    DelimitedScope<'[',_']'>::DelimitedScope(&local_38,W,N);
    if ((this->Hdr).super_HeaderPOD.ForeignTypeUnitCount != 0) {
      TU = 0;
      do {
        ScopedPrinter::printIndent(W);
        this_00 = W->OS;
        local_48 = getForeignTUSignature(this,TU);
        local_58.Fmt = "ForeignTU[%u]: 0x%016lx\n";
        local_58._vptr_format_object_base = (_func_int **)&PTR_home_00d778b8;
        local_40 = TU;
        raw_ostream::operator<<(this_00,&local_58);
        TU = TU + 1;
      } while (TU < (this->Hdr).super_HeaderPOD.ForeignTypeUnitCount);
    }
    DelimitedScope<'[',_']'>::~DelimitedScope(&local_38);
  }
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpForeignTUs(ScopedPrinter &W) const {
  if (Hdr.ForeignTypeUnitCount == 0)
    return;

  ListScope TUScope(W, "Foreign Type Unit signatures");
  for (uint32_t TU = 0; TU < Hdr.ForeignTypeUnitCount; ++TU) {
    W.startLine() << format("ForeignTU[%u]: 0x%016" PRIx64 "\n", TU,
                            getForeignTUSignature(TU));
  }
}